

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

ALLEGRO_DISPLAY * al_get_current_display(void)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
    lVar2 = *plVar1;
    if (lVar2 == 0) {
      return (ALLEGRO_DISPLAY *)0x0;
    }
  }
  return *(ALLEGRO_DISPLAY **)(lVar2 + 0xd0);
}

Assistant:

ALLEGRO_DISPLAY *al_get_current_display(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return NULL;
   return tls->current_display;
}